

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowSize(GLFWwindow *handle,int width,int height)

{
  _GLFWwindow *window;
  int height_local;
  int width_local;
  GLFWwindow *handle_local;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/window.c"
                  ,0x23e,"void glfwSetWindowSize(GLFWwindow *, int, int)");
  }
  if (-1 < width) {
    if (-1 < height) {
      if (_glfw.initialized == 0) {
        _glfwInputError(0x10001,(char *)0x0);
      }
      else {
        *(int *)(handle + 0x34) = width;
        *(int *)(handle + 0x38) = height;
        _glfwPlatformSetWindowSize((_GLFWwindow *)handle,width,height);
      }
      return;
    }
    __assert_fail("height >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/window.c"
                  ,0x240,"void glfwSetWindowSize(GLFWwindow *, int, int)");
  }
  __assert_fail("width >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/window.c"
                ,0x23f,"void glfwSetWindowSize(GLFWwindow *, int, int)");
}

Assistant:

GLFWAPI void glfwSetWindowSize(GLFWwindow* handle, int width, int height)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT();

    window->videoMode.width  = width;
    window->videoMode.height = height;

    _glfwPlatformSetWindowSize(window, width, height);
}